

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O1

bool __thiscall cfd::core::Psbt::IsFindTxInSignature(Psbt *this,uint32_t index,Pubkey *pubkey)

{
  void *pvVar1;
  size_t sVar2;
  CfdException *this_00;
  undefined4 in_register_00000034;
  int ret;
  size_t exist;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key_vec;
  int local_6c;
  undefined1 local_68 [32];
  size_t local_48;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  
  (*this->_vptr_Psbt[2])(this,CONCAT44(in_register_00000034,index),0xabb,"IsFindTxInSignature");
  pvVar1 = this->wally_psbt_pointer_;
  Pubkey::GetData((ByteData *)local_68,pubkey);
  ByteData::GetBytes(&local_40,(ByteData *)local_68);
  if ((pointer)local_68._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_68._0_8_);
  }
  local_48 = 0;
  local_6c = wally_map_find((wally_map *)
                            (*(long *)((long)pvVar1 + 0x10) + (ulong)index * 0x110 + 0x60),
                            local_40.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_40.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)local_40.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,&local_48);
  sVar2 = local_48;
  if (local_6c == 0) {
    if (local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    return sVar2 != 0;
  }
  local_68._0_8_ = "cfdcore_psbt.cpp";
  local_68._8_4_ = 0xac4;
  local_68._16_8_ = "IsFindTxInSignature";
  logger::log<int&>((CfdSourceLocation *)local_68,kCfdLogLevelWarning,"wally_map_find NG[{}]",
                    &local_6c);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_68._0_8_ = local_68 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,"psbt find signature key error.","");
  CfdException::CfdException(this_00,kCfdMemoryFullError,(string *)local_68);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

bool Psbt::IsFindTxInSignature(uint32_t index, const Pubkey &pubkey) const {
  CheckTxInIndex(index, __LINE__, __FUNCTION__);
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  auto key_vec = pubkey.GetData().GetBytes();
  size_t exist = 0;
  int ret = wally_map_find(
      &psbt_pointer->inputs[index].signatures, key_vec.data(), key_vec.size(),
      &exist);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_map_find NG[{}]", ret);
    throw CfdException(kCfdMemoryFullError, "psbt find signature key error.");
  }
  return (exist == 0) ? false : true;
}